

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

void __thiscall
vkt::rasterization::anon_unknown_0::PointTestInstance::generatePoints
          (PointTestInstance *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *outPoints)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  ostringstream *poVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  pointer pVVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  long lVar19;
  pointer pSVar20;
  int pointNdx;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  MessageBuilder local_1b0;
  
  uVar15 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,6);
  if ((uint)iteration < 3) {
    fVar4 = *(float *)(&DAT_009c4e10 + uVar15 * 4);
    fVar5 = *(float *)(&DAT_009c4e1c + uVar15 * 4);
    fVar6 = *(float *)(&DAT_009c4e28 + uVar15 * 4);
    fVar7 = *(float *)(&DAT_009c4e34 + uVar15 * 4);
    fVar8 = *(float *)(&DAT_009c4e40 + uVar15 * 4);
    fVar9 = *(float *)(&DAT_009c4e4c + uVar15 * 4);
    fVar10 = *(float *)(&DAT_009c4e58 + uVar15 * 4);
    fVar11 = *(float *)(&DAT_009c4e64 + uVar15 * 4);
    fVar12 = *(float *)(&DAT_009c4e70 + uVar15 * 4);
    fVar13 = *(float *)(&DAT_009c4e7c + uVar15 * 4);
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14->m_data[0] = *(float *)(&DAT_009c4e04 + uVar15 * 4);
    pVVar14->m_data[1] = fVar4;
    pVVar14->m_data[2] = 0.0;
    pVVar14->m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[1].m_data[0] = fVar5;
    pVVar14[1].m_data[1] = fVar6;
    pVVar14[1].m_data[2] = 0.0;
    pVVar14[1].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[2].m_data[0] = fVar7;
    pVVar14[2].m_data[1] = fVar8;
    pVVar14[2].m_data[2] = 0.0;
    pVVar14[2].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[3].m_data[0] = fVar9;
    pVVar14[3].m_data[1] = 0.2;
    pVVar14[3].m_data[2] = 0.0;
    pVVar14[3].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[4].m_data[0] = fVar10;
    pVVar14[4].m_data[1] = fVar11;
    pVVar14[4].m_data[2] = 0.0;
    pVVar14[4].m_data[3] = 1.0;
    pVVar14 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[5].m_data[0] = fVar12;
    pVVar14[5].m_data[1] = fVar13;
    pVVar14[5].m_data[2] = 0.0;
    pVVar14[5].m_data[3] = 1.0;
  }
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  resize(outPoints,
         (long)(outData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(outData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start >> 4);
  pSVar20 = (outPoints->
            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar22 = 0;
  lVar23 = 0;
  lVar21 = 0;
  while( true ) {
    lVar19 = (long)(outPoints->
                   super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20;
    if ((int)(lVar19 / 0x24) <= lVar21) break;
    puVar1 = (undefined4 *)
             ((long)((outData->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22);
    uVar16 = puVar1[1];
    uVar17 = puVar1[2];
    uVar18 = puVar1[3];
    puVar2 = (undefined4 *)((long)(pSVar20->position).m_data + lVar23);
    *puVar2 = *puVar1;
    puVar2[1] = uVar16;
    puVar2[2] = uVar17;
    puVar2[3] = uVar18;
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])
              (this,0x24,lVar19 % 0x24);
    pSVar20 = (outPoints->
              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)(&pSVar20->color + 1) + lVar23) = extraout_XMM0_Da;
    lVar21 = lVar21 + 1;
    lVar23 = lVar23 + 0x24;
    lVar22 = lVar22 + 0x10;
  }
  local_1b0.m_log =
       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  poVar3 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
  std::operator<<((ostream *)poVar3,"Rendering ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<((ostream *)poVar3," point(s): (point size = ");
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
  std::ostream::operator<<(poVar3,extraout_XMM0_Da_00);
  std::operator<<((ostream *)poVar3,")");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
  poVar3 = &local_1b0.m_str;
  lVar22 = 0;
  for (lVar21 = 0;
      lVar21 < (int)(((long)(outPoints->
                            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(outPoints->
                           super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x24); lVar21 = lVar21 + 1)
  {
    local_1b0.m_log =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
    std::operator<<((ostream *)poVar3,"Point ");
    std::ostream::operator<<(poVar3,(int)lVar21 + 1);
    std::operator<<((ostream *)poVar3,":\t");
    tcu::operator<<((ostream *)poVar3,
                    (Vector<float,_4> *)
                    ((long)(((outPoints->
                             super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                             )._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar22)
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
    lVar22 = lVar22 + 0x24;
  }
  return;
}

Assistant:

void PointTestInstance::generatePoints (int iteration, std::vector<tcu::Vec4>& outData, std::vector<PointSceneSpec::ScenePoint>& outPoints)
{
	outData.resize(6);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.2f,  0.8f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,  0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.5f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-0.2f, -0.4f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(-0.4f,  0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(   0.4f,   1.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  0.3f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( -0.4f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f);
			break;
	}

	outPoints.resize(outData.size());
	for (int pointNdx = 0; pointNdx < (int)outPoints.size(); ++pointNdx)
	{
		outPoints[pointNdx].position = outData[pointNdx];
		outPoints[pointNdx].pointSize = getPointSize();
	}

	// log
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Rendering " << outPoints.size() << " point(s): (point size = " << getPointSize() << ")" << tcu::TestLog::EndMessage;
	for (int pointNdx = 0; pointNdx < (int)outPoints.size(); ++pointNdx)
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Point " << (pointNdx+1) << ":\t" << outPoints[pointNdx].position << tcu::TestLog::EndMessage;
}